

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

char * __thiscall kj::Vector<char>::add<unsigned_char&>(Vector<char> *this,uchar *params)

{
  char *pcVar1;
  uchar *puVar2;
  
  puVar2 = (uchar *)(this->builder).pos;
  if (puVar2 == (uchar *)(this->builder).endPtr) {
    grow(this,0);
    puVar2 = (uchar *)(this->builder).pos;
  }
  *puVar2 = *params;
  pcVar1 = (this->builder).pos;
  (this->builder).pos = pcVar1 + 1;
  return pcVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }